

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall SVGChart::PPlot::DrawPlotBackground(PPlot *this,PRect *inRect,Painter *inPainter)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  float fVar7;
  string theTitle;
  long *local_58;
  long local_50;
  long local_48 [2];
  undefined8 local_38;
  
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mPlotBackground).mStyle);
  if ((this->mPlotBackground).mTransparent == false) {
    (*inPainter->_vptr_Painter[7])
              (inPainter,(ulong)(this->mPlotBackground).mPlotRegionBackColor.mR,
               (ulong)(this->mPlotBackground).mPlotRegionBackColor.mG,
               (ulong)(this->mPlotBackground).mPlotRegionBackColor.mB);
    (*inPainter->_vptr_Painter[1])
              (inPainter,(ulong)(uint)inRect->mX,(ulong)(uint)inRect->mY,(ulong)(uint)inRect->mW,
               (ulong)(uint)inRect->mH);
  }
  local_58 = local_48;
  pcVar1 = (this->mPlotBackground).mTitle._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (this->mPlotBackground).mTitle._M_string_length);
  if (local_50 != 0) {
    iVar5 = (*inPainter->_vptr_Painter[8])(inPainter,local_58);
    lVar2 = inRect->mX;
    lVar3 = inRect->mY;
    lVar4 = inRect->mW;
    iVar6 = (*inPainter->_vptr_Painter[9])(inPainter);
    local_38 = CONCAT44(extraout_var,iVar6);
    fVar7 = floorf((float)((double)(lVar4 - iVar5) * 0.5 + (double)lVar2) + 0.5);
    (*inPainter->_vptr_Painter[10])
              (inPainter,(ulong)(uint)(int)fVar7,
               (ulong)(uint)(((int)lVar3 - (int)local_38) + (int)(this->mMargins).mTop),local_58);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return true;
}

Assistant:

bool PPlot::DrawPlotBackground (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mPlotBackground.mStyle);

      if (!mPlotBackground.mTransparent) {
        PColor theC = mPlotBackground.mPlotRegionBackColor;
        inPainter.SetFillColor (theC.mR, theC.mG, theC.mB);
        inPainter.FillRect (inRect.mX, inRect.mY, inRect.mW, inRect.mH);
      }
      string theTitle = mPlotBackground.mTitle;
      if (theTitle.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theTitle.c_str ());
        int theX = Round (inRect.mX + (inRect.mW-theW)*0.5);
        int theY = inRect.mY - inPainter.GetFontHeight ()+mMargins.mTop;
        inPainter.DrawText (theX, theY, theTitle.c_str ());
      }
      return true;
    }